

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgb2spec_opt.cpp
# Opt level: O3

void cie_lab(double *p)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int j;
  long lVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 extraout_var [56];
  
  dVar7 = xyz_whitepoint[2];
  dVar6 = xyz_whitepoint[0];
  auVar12 = ZEXT864(0) << 0x40;
  auVar11 = ZEXT864(0) << 0x40;
  lVar4 = 0;
  auVar9 = ZEXT864(0);
  do {
    auVar10._8_8_ = 0;
    auVar10._0_8_ = p[lVar4];
    auVar1._8_8_ = 0;
    auVar1._0_8_ = rgb_to_xyz[0][lVar4];
    auVar1 = vfmadd231sd_fma(auVar12._0_16_,auVar10,auVar1);
    auVar12 = ZEXT1664(auVar1);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = rgb_to_xyz[1][lVar4];
    auVar2 = vfmadd231sd_fma(auVar9._0_16_,auVar10,auVar2);
    auVar9 = ZEXT1664(auVar2);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = rgb_to_xyz[2][lVar4];
    auVar3 = vfmadd231sd_fma(auVar11._0_16_,auVar10,auVar3);
    auVar11 = ZEXT1664(auVar3);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  dVar5 = auVar2._0_8_ / xyz_whitepoint[1];
  if (dVar5 <= 0.008856451679035631) {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = dVar5 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    auVar9._0_8_ = cbrt(dVar5);
    auVar9._8_56_ = extraout_var;
    auVar8 = auVar9._0_16_;
  }
  auVar2 = vfmadd213sd_fma(ZEXT816(0x405d000000000000),auVar8,ZEXT816(0xc030000000000000));
  dVar6 = auVar1._0_8_ / dVar6;
  *p = auVar2._0_8_;
  if (dVar6 <= 0.008856451679035631) {
    dVar6 = dVar6 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    dVar6 = cbrt(dVar6);
  }
  if (dVar5 <= 0.008856451679035631) {
    dVar5 = dVar5 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    dVar5 = cbrt(dVar5);
  }
  p[1] = (dVar6 - dVar5) * 500.0;
  dVar7 = auVar3._0_8_ / dVar7;
  if (dVar7 <= 0.008856451679035631) {
    dVar6 = dVar7 / 0.12841854934601665 + 0.13793103448275862;
  }
  else {
    dVar6 = cbrt(dVar7);
  }
  p[2] = (dVar5 - dVar6) * 200.0;
  return;
}

Assistant:

void cie_lab(double *p) {
    double X = 0.0, Y = 0.0, Z = 0.0, Xw = xyz_whitepoint[0], Yw = xyz_whitepoint[1],
           Zw = xyz_whitepoint[2];

    for (int j = 0; j < 3; ++j) {
        X += p[j] * rgb_to_xyz[0][j];
        Y += p[j] * rgb_to_xyz[1][j];
        Z += p[j] * rgb_to_xyz[2][j];
    }

    auto f = [](double t) -> double {
        double delta = 6.0 / 29.0;
        if (t > delta * delta * delta)
            return cbrt(t);
        else
            return t / (delta * delta * 3.0) + (4.0 / 29.0);
    };

    p[0] = 116.0 * f(Y / Yw) - 16.0;
    p[1] = 500.0 * (f(X / Xw) - f(Y / Yw));
    p[2] = 200.0 * (f(Y / Yw) - f(Z / Zw));
}